

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdas_obj.cpp
# Opt level: O3

uint32_t parseNumber(FileStackNode *where,uint32_t lineNo,char *str,NumberType base)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  uint32_t uVar5;
  char *pcVar6;
  bool bVar7;
  
  if (*str == '\0') {
    fatal(where,lineNo,"Expected number, got empty string");
  }
  iVar2 = toupper((int)*str);
  pvVar3 = memchr("0123456789ABCDEF",iVar2,0x11);
  if (pvVar3 != (void *)0x0) {
    lVar4 = (long)pvVar3 + -0x10ed81;
    bVar7 = false;
    uVar5 = 0;
    if (lVar4 < (long)(ulong)base) {
      uVar5 = 0;
      pcVar6 = str;
      do {
        pcVar6 = pcVar6 + 1;
        uVar5 = (int)lVar4 + uVar5 * base;
        cVar1 = *pcVar6;
        iVar2 = toupper((int)cVar1);
        pvVar3 = memchr("0123456789ABCDEF",iVar2,0x11);
        if (pvVar3 == (void *)0x0) break;
        lVar4 = (long)pvVar3 + -0x10ed81;
      } while (lVar4 < (long)(ulong)base);
      bVar7 = cVar1 == '\0';
    }
    if (bVar7) {
      return uVar5;
    }
  }
  fatal(where,lineNo,"Expected number, got \"%s\"",str);
}

Assistant:

static uint32_t parseNumber(struct FileStackNode const *where, uint32_t lineNo, char const *restrict str, enum NumberType base) {
	if (str[0] == '\0')
		fatal(where, lineNo, "Expected number, got empty string");

	char const *endptr;
	uint32_t res = readNumber(str, &endptr, base);

	if (*endptr != '\0')
		fatal(where, lineNo, "Expected number, got \"%s\"", str);
	return res;
}